

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O2

int SMPI_Allgather(void *sendbuf,int sendcount,SMPI_Datatype sendtype,void *recvbuf,int recvcount,
                  SMPI_Datatype recvtype,SMPI_Comm comm)

{
  string local_28;
  
  switch(sendtype) {
  case SMPI_INT:
    switch(recvtype) {
    case SMPI_INT:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<int,int>
                (comm,(int *)sendbuf,(long)sendcount,(int *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_LONG:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<int,long>
                (comm,(int *)sendbuf,(long)sendcount,(long *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_SIZE_T:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<int,unsigned_long>
                (comm,(int *)sendbuf,(long)sendcount,(unsigned_long *)recvbuf,(long)recvcount,
                 &local_28);
      break;
    case SMPI_CHAR:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<int,char>
                (comm,(int *)sendbuf,(long)sendcount,(char *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_BYTE:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<int,unsigned_char>
                (comm,(int *)sendbuf,(long)sendcount,(uchar *)recvbuf,(long)recvcount,&local_28);
      break;
    default:
      goto switchD_006c7418_default;
    }
    break;
  case SMPI_LONG:
    switch(recvtype) {
    case SMPI_INT:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<long,int>
                (comm,(long *)sendbuf,(long)sendcount,(int *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_LONG:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<long,long>
                (comm,(long *)sendbuf,(long)sendcount,(long *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_SIZE_T:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<long,unsigned_long>
                (comm,(long *)sendbuf,(long)sendcount,(unsigned_long *)recvbuf,(long)recvcount,
                 &local_28);
      break;
    case SMPI_CHAR:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<long,char>
                (comm,(long *)sendbuf,(long)sendcount,(char *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_BYTE:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<long,unsigned_char>
                (comm,(long *)sendbuf,(long)sendcount,(uchar *)recvbuf,(long)recvcount,&local_28);
      break;
    default:
      goto switchD_006c7418_default;
    }
    break;
  case SMPI_SIZE_T:
    switch(recvtype) {
    case SMPI_INT:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<unsigned_long,int>
                (comm,(unsigned_long *)sendbuf,(long)sendcount,(int *)recvbuf,(long)recvcount,
                 &local_28);
      break;
    case SMPI_LONG:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<unsigned_long,long>
                (comm,(unsigned_long *)sendbuf,(long)sendcount,(long *)recvbuf,(long)recvcount,
                 &local_28);
      break;
    case SMPI_SIZE_T:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<unsigned_long,unsigned_long>
                (comm,(unsigned_long *)sendbuf,(long)sendcount,(unsigned_long *)recvbuf,
                 (long)recvcount,&local_28);
      break;
    case SMPI_CHAR:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<unsigned_long,char>
                (comm,(unsigned_long *)sendbuf,(long)sendcount,(char *)recvbuf,(long)recvcount,
                 &local_28);
      break;
    case SMPI_BYTE:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<unsigned_long,unsigned_char>
                (comm,(unsigned_long *)sendbuf,(long)sendcount,(uchar *)recvbuf,(long)recvcount,
                 &local_28);
      break;
    default:
      goto switchD_006c7418_default;
    }
    break;
  case SMPI_CHAR:
    switch(recvtype) {
    case SMPI_INT:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<char,int>
                (comm,(char *)sendbuf,(long)sendcount,(int *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_LONG:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<char,long>
                (comm,(char *)sendbuf,(long)sendcount,(long *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_SIZE_T:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<char,unsigned_long>
                (comm,(char *)sendbuf,(long)sendcount,(unsigned_long *)recvbuf,(long)recvcount,
                 &local_28);
      break;
    case SMPI_CHAR:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<char,char>
                (comm,(char *)sendbuf,(long)sendcount,(char *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_BYTE:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<char,unsigned_char>
                (comm,(char *)sendbuf,(long)sendcount,(uchar *)recvbuf,(long)recvcount,&local_28);
      break;
    default:
      goto switchD_006c7418_default;
    }
    break;
  case SMPI_BYTE:
    switch(recvtype) {
    case SMPI_INT:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<unsigned_char,int>
                (comm,(uchar *)sendbuf,(long)sendcount,(int *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_LONG:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<unsigned_char,long>
                (comm,(uchar *)sendbuf,(long)sendcount,(long *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_SIZE_T:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<unsigned_char,unsigned_long>
                (comm,(uchar *)sendbuf,(long)sendcount,(unsigned_long *)recvbuf,(long)recvcount,
                 &local_28);
      break;
    case SMPI_CHAR:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<unsigned_char,char>
                (comm,(uchar *)sendbuf,(long)sendcount,(char *)recvbuf,(long)recvcount,&local_28);
      break;
    case SMPI_BYTE:
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allgather<unsigned_char,unsigned_char>
                (comm,(uchar *)sendbuf,(long)sendcount,(uchar *)recvbuf,(long)recvcount,&local_28);
      break;
    default:
      goto switchD_006c7418_default;
    }
    break;
  default:
    goto switchD_006c7418_default;
  }
  std::__cxx11::string::~string((string *)&local_28);
switchD_006c7418_default:
  return 0;
}

Assistant:

int SMPI_Allgather(const void *sendbuf, int sendcount, SMPI_Datatype sendtype, void *recvbuf,
                   int recvcount, SMPI_Datatype recvtype, SMPI_Comm comm)
{
    int ret = 0;
    switch (sendtype)
    {
#define F(type)                                                                                    \
    ret = SMPI_Allgather_Impl(static_cast<const type *>(sendbuf), sendcount, recvbuf, recvcount,   \
                              recvtype, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return ret;
}